

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O0

void idx2::InverseCdf53(v3i *M3,int Iter,array<idx2::subband> *Subbands,
                       transform_info *TransformDetails,volume *Vol,bool CoarsestLevel)

{
  int iVar1;
  double dVar2;
  undefined1 auVar3 [16];
  int iVar4;
  grid *Grid;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double local_8c8;
  double local_8b8;
  double local_8a8;
  double local_898;
  double local_888;
  double local_878;
  int local_86c;
  int D;
  int I;
  grid_iterator<unsigned_char> It_9;
  grid_iterator<unsigned_char> ItEnd_9;
  grid_iterator<signed_char> It_8;
  grid_iterator<signed_char> ItEnd_8;
  grid_iterator<unsigned_short> It_7;
  grid_iterator<unsigned_short> ItEnd_7;
  grid_iterator<short> It_6;
  grid_iterator<short> ItEnd_6;
  grid_iterator<unsigned_int> It_5;
  grid_iterator<unsigned_int> ItEnd_5;
  grid_iterator<int> It_4;
  grid_iterator<int> ItEnd_4;
  grid_iterator<unsigned_long> It_3;
  grid_iterator<unsigned_long> ItEnd_3;
  grid_iterator<long> It_2;
  grid_iterator<long> ItEnd_2;
  grid_iterator<float> It_1;
  grid_iterator<float> ItEnd_1;
  grid_iterator<double> It;
  grid_iterator<double> ItEnd;
  f64 W;
  f64 Idx2;
  f64 Wy;
  f64 Wx;
  subband *S;
  int I_1;
  bool CoarsestLevel_local;
  volume *Vol_local;
  transform_info *TransformDetails_local;
  array<idx2::subband> *Subbands_local;
  int Iter_local;
  v3i *M3_local;
  
  S._0_4_ = 0;
  do {
    if (Subbands->Size <= (long)(int)S) {
      local_86c = TransformDetails->StackSize;
      while( true ) {
        iVar4 = local_86c + -1;
        if (local_86c < 1) {
          return;
        }
        if (0x1f < iVar4) break;
        iVar1 = (TransformDetails->StackAxes).Arr[iVar4];
        local_86c = iVar4;
        if (Vol->Type == float64) {
          if (iVar1 == 0) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53X<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 1) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Y<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 2) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Z<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
        }
        else if (Vol->Type == float32) {
          if (iVar1 == 0) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53X<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 1) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Y<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 2) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Z<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
        }
        else if (Vol->Type == int64) {
          if (iVar1 == 0) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53X<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 1) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Y<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 2) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Z<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
        }
        else if (Vol->Type == uint64) {
          if (iVar1 == 0) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53X<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 1) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Y<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 2) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Z<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
        }
        else if (Vol->Type == int32) {
          if (iVar1 == 0) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53X<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 1) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Y<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 2) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Z<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
        }
        else if (Vol->Type == uint32) {
          if (iVar1 == 0) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53X<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 1) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Y<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 2) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Z<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
        }
        else if (Vol->Type == int16) {
          if (iVar1 == 0) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53X<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 1) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Y<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 2) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Z<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
        }
        else if (Vol->Type == uint16) {
          if (iVar1 == 0) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53X<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 1) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Y<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 2) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Z<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
        }
        else if (Vol->Type == int8) {
          if (iVar1 == 0) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53X<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 1) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Y<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 2) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Z<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
        }
        else if (Vol->Type == uint8) {
          if (iVar1 == 0) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53X<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 1) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Y<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
          else if (iVar1 == 2) {
            if (0x1f < iVar4) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::grid, 32>::operator[](int) const [t = idx2::grid, N = 32]"
                           );
            }
            ILiftCdf53Z<double>((TransformDetails->StackGrids).Arr + iVar4,M3,Normal,Vol);
          }
        }
      }
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,"t &idx2::stack_array<int, 32>::operator[](int) const [t = int, N = 32]")
      ;
    }
    if (((int)S != 0) || (CoarsestLevel)) {
      Grid = (grid *)((Subbands->Buffer).Data + (long)(int)S * 0x40);
      if ((M3->field_0).field_0.X == 1) {
        local_878 = 1.0;
      }
      else {
        if (*(char *)((long)&Grid[2].super_extent.From + 6) == '\0') {
          iVar4 = Iter * TransformDetails->NPasses +
                  (int)*(char *)((long)&Grid[2].super_extent.From + 3) + -1;
          if (0xf < iVar4) {
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,
                          "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                         );
          }
          local_888 = (TransformDetails->BasisNorms).ScalNorms.Arr[iVar4];
        }
        else {
          iVar4 = Iter * TransformDetails->NPasses +
                  (int)*(char *)((long)&Grid[2].super_extent.From + 3);
          if (0xf < iVar4) {
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,
                          "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                         );
          }
          local_888 = (TransformDetails->BasisNorms).WaveNorms.Arr[iVar4];
        }
        local_878 = local_888;
      }
      if ((M3->field_0).field_0.Y == 1) {
        local_898 = 1.0;
      }
      else {
        if (*(char *)((long)&Grid[2].super_extent.From + 7) == '\0') {
          iVar4 = Iter * TransformDetails->NPasses +
                  (int)*(char *)((long)&Grid[2].super_extent.From + 4) + -1;
          if (0xf < iVar4) {
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,
                          "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                         );
          }
          local_8a8 = (TransformDetails->BasisNorms).ScalNorms.Arr[iVar4];
        }
        else {
          iVar4 = Iter * TransformDetails->NPasses +
                  (int)*(char *)((long)&Grid[2].super_extent.From + 4);
          if (0xf < iVar4) {
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,
                          "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                         );
          }
          local_8a8 = (TransformDetails->BasisNorms).WaveNorms.Arr[iVar4];
        }
        local_898 = local_8a8;
      }
      if ((M3->field_0).field_0.Z == 1) {
        local_8b8 = 1.0;
      }
      else {
        if ((char)Grid[2].super_extent.Dims == '\0') {
          iVar4 = Iter * TransformDetails->NPasses +
                  (int)*(char *)((long)&Grid[2].super_extent.From + 5) + -1;
          if (0xf < iVar4) {
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,
                          "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                         );
          }
          local_8c8 = (TransformDetails->BasisNorms).ScalNorms.Arr[iVar4];
        }
        else {
          iVar4 = Iter * TransformDetails->NPasses +
                  (int)*(char *)((long)&Grid[2].super_extent.From + 5);
          if (0xf < iVar4) {
            __assert_fail("Idx < N",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x20c,
                          "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                         );
          }
          local_8c8 = (TransformDetails->BasisNorms).WaveNorms.Arr[iVar4];
        }
        local_8b8 = local_8c8;
      }
      dVar6 = 1.0 / (local_878 * local_898 * local_8b8);
      if (Vol->Type == float64) {
        End<double>((grid_iterator<double> *)((long)&It.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
        Begin<double>((grid_iterator<double> *)((long)&ItEnd_1.N.field_0.field_3.XY.field_0 + 4),
                      Grid,Vol);
        while (ItEnd_1.N.field_0.field_4.YZ.field_0 != It.N.field_0.field_4.YZ.field_0) {
          *(double *)ItEnd_1.N.field_0.field_4.YZ.field_0 =
               *(double *)ItEnd_1.N.field_0.field_4.YZ.field_0 * dVar6;
          grid_iterator<double>::operator++
                    ((grid_iterator<double> *)((long)&ItEnd_1.N.field_0.field_3.XY.field_0 + 4));
        }
      }
      else if (Vol->Type == float32) {
        End<float>((grid_iterator<float> *)((long)&It_1.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
        Begin<float>((grid_iterator<float> *)((long)&ItEnd_2.N.field_0.field_3.XY.field_0 + 4),Grid,
                     Vol);
        while (ItEnd_2.N.field_0.field_4.YZ.field_0 != It_1.N.field_0.field_4.YZ.field_0) {
          *(float *)ItEnd_2.N.field_0.field_4.YZ.field_0 =
               (float)((double)*(float *)ItEnd_2.N.field_0.field_4.YZ.field_0 * dVar6);
          grid_iterator<float>::operator++
                    ((grid_iterator<float> *)((long)&ItEnd_2.N.field_0.field_3.XY.field_0 + 4));
        }
      }
      else if (Vol->Type == int64) {
        End<long>((grid_iterator<long> *)((long)&It_2.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
        Begin<long>((grid_iterator<long> *)((long)&ItEnd_3.N.field_0.field_3.XY.field_0 + 4),Grid,
                    Vol);
        while (ItEnd_3.N.field_0.field_4.YZ.field_0 != It_2.N.field_0.field_4.YZ.field_0) {
          *(long *)ItEnd_3.N.field_0.field_4.YZ.field_0 =
               (long)((double)*(long *)ItEnd_3.N.field_0.field_4.YZ.field_0 * dVar6);
          grid_iterator<long>::operator++
                    ((grid_iterator<long> *)((long)&ItEnd_3.N.field_0.field_3.XY.field_0 + 4));
        }
      }
      else if (Vol->Type == uint64) {
        End<unsigned_long>((grid_iterator<unsigned_long> *)
                           ((long)&It_3.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
        Begin<unsigned_long>
                  ((grid_iterator<unsigned_long> *)((long)&ItEnd_4.N.field_0.field_3.XY.field_0 + 4)
                   ,Grid,Vol);
        while (ItEnd_4.N.field_0.field_4.YZ.field_0 != It_3.N.field_0.field_4.YZ.field_0) {
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)ItEnd_4.N.field_0.field_4.YZ.field_0;
          auVar7 = vpunpckldq_avx(auVar7,_DAT_002e9df0);
          auVar7 = vsubpd_avx(auVar7,_DAT_002e9e00);
          auVar3 = vpermilpd_avx(auVar7,1);
          dVar2 = (auVar3._0_8_ + auVar7._0_8_) * dVar6;
          uVar5 = (ulong)dVar2;
          *(ulong *)ItEnd_4.N.field_0.field_4.YZ.field_0 =
               uVar5 | (long)(dVar2 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f;
          grid_iterator<unsigned_long>::operator++
                    ((grid_iterator<unsigned_long> *)
                     ((long)&ItEnd_4.N.field_0.field_3.XY.field_0 + 4));
        }
      }
      else if (Vol->Type == int32) {
        End<int>((grid_iterator<int> *)((long)&It_4.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
        Begin<int>((grid_iterator<int> *)((long)&ItEnd_5.N.field_0.field_3.XY.field_0 + 4),Grid,Vol)
        ;
        while (ItEnd_5.N.field_0.field_4.YZ.field_0 != It_4.N.field_0.field_4.YZ.field_0) {
          *(int *)ItEnd_5.N.field_0.field_4.YZ.field_0 =
               (int)((double)*(int *)ItEnd_5.N.field_0.field_4.YZ.field_0 * dVar6);
          grid_iterator<int>::operator++
                    ((grid_iterator<int> *)((long)&ItEnd_5.N.field_0.field_3.XY.field_0 + 4));
        }
      }
      else if (Vol->Type == uint32) {
        End<unsigned_int>((grid_iterator<unsigned_int> *)
                          ((long)&It_5.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
        Begin<unsigned_int>((grid_iterator<unsigned_int> *)
                            ((long)&ItEnd_6.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
        while (ItEnd_6.N.field_0.field_4.YZ.field_0 != It_5.N.field_0.field_4.YZ.field_0) {
          *(int *)ItEnd_6.N.field_0.field_4.YZ.field_0 =
               (int)(long)((double)*(uint *)ItEnd_6.N.field_0.field_4.YZ.field_0 * dVar6);
          grid_iterator<unsigned_int>::operator++
                    ((grid_iterator<unsigned_int> *)
                     ((long)&ItEnd_6.N.field_0.field_3.XY.field_0 + 4));
        }
      }
      else if (Vol->Type == int16) {
        End<short>((grid_iterator<short> *)((long)&It_6.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
        Begin<short>((grid_iterator<short> *)((long)&ItEnd_7.N.field_0.field_3.XY.field_0 + 4),Grid,
                     Vol);
        while (ItEnd_7.N.field_0.field_4.YZ.field_0 != It_6.N.field_0.field_4.YZ.field_0) {
          *(short *)ItEnd_7.N.field_0.field_4.YZ.field_0 =
               (short)(int)((double)(int)*(short *)ItEnd_7.N.field_0.field_4.YZ.field_0 * dVar6);
          grid_iterator<short>::operator++
                    ((grid_iterator<short> *)((long)&ItEnd_7.N.field_0.field_3.XY.field_0 + 4));
        }
      }
      else if (Vol->Type == uint16) {
        End<unsigned_short>((grid_iterator<unsigned_short> *)
                            ((long)&It_7.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
        Begin<unsigned_short>
                  ((grid_iterator<unsigned_short> *)
                   ((long)&ItEnd_8.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
        while (ItEnd_8.N.field_0.field_4.YZ.field_0 != It_7.N.field_0.field_4.YZ.field_0) {
          *(short *)ItEnd_8.N.field_0.field_4.YZ.field_0 =
               (short)(int)((double)*(ushort *)ItEnd_8.N.field_0.field_4.YZ.field_0 * dVar6);
          grid_iterator<unsigned_short>::operator++
                    ((grid_iterator<unsigned_short> *)
                     ((long)&ItEnd_8.N.field_0.field_3.XY.field_0 + 4));
        }
      }
      else if (Vol->Type == int8) {
        End<signed_char>((grid_iterator<signed_char> *)
                         ((long)&It_8.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
        Begin<signed_char>((grid_iterator<signed_char> *)
                           ((long)&ItEnd_9.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
        while (ItEnd_9.N.field_0.field_4.YZ.field_0 != It_8.N.field_0.field_4.YZ.field_0) {
          *(char *)ItEnd_9.N.field_0.field_4.YZ.field_0 =
               (char)(int)((double)(int)*(char *)ItEnd_9.N.field_0.field_4.YZ.field_0 * dVar6);
          grid_iterator<signed_char>::operator++
                    ((grid_iterator<signed_char> *)((long)&ItEnd_9.N.field_0.field_3.XY.field_0 + 4)
                    );
        }
      }
      else if (Vol->Type == uint8) {
        End<unsigned_char>((grid_iterator<unsigned_char> *)
                           ((long)&It_9.N.field_0.field_3.XY.field_0 + 4),Grid,Vol);
        Begin<unsigned_char>((grid_iterator<unsigned_char> *)&D,Grid,Vol);
        while (_D != (anon_union_8_4_6ba14846_for_v2<int>_1)It_9.N.field_0.field_4.YZ.field_0) {
          *(byte *)_D = (byte)(int)((double)*(byte *)_D * dVar6);
          grid_iterator<unsigned_char>::operator++((grid_iterator<unsigned_char> *)&D);
        }
      }
    }
    S._0_4_ = (int)S + 1;
  } while( true );
}

Assistant:

void
InverseCdf53(const v3i& M3,
             int Iter,
             const array<subband>& Subbands,
             const transform_info& TransformDetails,
             volume* Vol,
             bool CoarsestLevel)
{
  /* inverse normalize if required */
  idx2_Assert(IsFloatingPoint(Vol->Type));
  for (int I = 0; I < Size(Subbands); ++I)
  {
    if (I == 0 && !CoarsestLevel)
      continue; // do not normalize subband 0
    subband& S = Subbands[I];
    f64 Wx = M3.X == 1
               ? 1
               : (S.LowHigh3.X == 0 ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.X - 1]
                                    : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.X]);
    f64 Wy = M3.Y == 1
               ? 1
               : (S.LowHigh3.Y == 0 ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Y - 1]
                                    : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Y]);
    f64 Idx2 = M3.Z == 1 ? 1
                         : (S.LowHigh3.Z == 0
                              ? TransformDetails.BasisNorms.ScalNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Z - 1]
                              : TransformDetails.BasisNorms.WaveNorms[Iter * TransformDetails.NPasses + S.Level3Rev.Z]);
    f64 W = 1.0 / (Wx * Wy * Idx2);
#define Body(type)                                                                                 \
  auto ItEnd = End<type>(S.Grid, *Vol);                                                            \
  for (auto It = Begin<type>(S.Grid, *Vol); It != ItEnd; ++It)                                     \
    *It = type(*It * W);
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }

  /* perform the inverse transform */
  int I = TransformDetails.StackSize;
  while (I-- > 0)
  {
    int D = TransformDetails.StackAxes[I];
#define Body(type)                                                                                 \
  switch (D)                                                                                       \
  {                                                                                                \
    case 0:                                                                                        \
      ILiftCdf53X<f64>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                            \
      break;                                                                                       \
    case 1:                                                                                        \
      ILiftCdf53Y<f64>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                            \
      break;                                                                                       \
    case 2:                                                                                        \
      ILiftCdf53Z<f64>(TransformDetails.StackGrids[I], M3, lift_option::Normal, Vol);                            \
      break;                                                                                       \
    default:                                                                                       \
      idx2_Assert(false);                                                                          \
      break;                                                                                       \
  };
    idx2_DispatchOnType(Vol->Type);
#undef Body
  }
}